

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcssparser.cpp
# Opt level: O0

bool setFontFamilyFromValues(QList<QCss::Value> *values,QFont *font,int start)

{
  bool bVar1;
  bool bVar2;
  QList<QCss::Value> *this;
  qsizetype qVar3;
  int in_EDX;
  QList<QCss::Value> *in_RDI;
  long in_FS_OFFSET;
  Value *v;
  int i;
  bool shouldAddSpace;
  QString str;
  QStringList families;
  QString family;
  undefined7 in_stack_ffffffffffffff68;
  undefined1 in_stack_ffffffffffffff6f;
  undefined4 in_stack_ffffffffffffff78;
  undefined2 in_stack_ffffffffffffff7c;
  QChar in_stack_ffffffffffffff7e;
  const_reference in_stack_ffffffffffffff80;
  int local_74;
  bool local_53;
  QChar local_52;
  undefined1 *local_50;
  undefined1 *local_48;
  undefined1 *local_40;
  undefined1 *local_38;
  undefined1 *local_30;
  undefined1 *local_28;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_20 = &DAT_aaaaaaaaaaaaaaaa;
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  local_10 = &DAT_aaaaaaaaaaaaaaaa;
  QString::QString((QString *)0xa3318a);
  local_38 = &DAT_aaaaaaaaaaaaaaaa;
  local_30 = &DAT_aaaaaaaaaaaaaaaa;
  local_28 = &DAT_aaaaaaaaaaaaaaaa;
  QList<QString>::QList((QList<QString> *)0xa331b8);
  bVar2 = false;
  local_74 = in_EDX;
  while( true ) {
    this = (QList<QCss::Value> *)(long)local_74;
    qVar3 = QList<QCss::Value>::size(in_RDI);
    if (qVar3 <= (long)this) break;
    in_stack_ffffffffffffff80 =
         QList<QCss::Value>::at(this,CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68));
    if (in_stack_ffffffffffffff80->type == TermOperatorComma) {
      QList<QString>::operator<<
                ((QList<QString> *)this,
                 (parameter_type)CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68));
      QString::clear((QString *)this);
      bVar2 = false;
    }
    else {
      local_50 = &DAT_aaaaaaaaaaaaaaaa;
      local_48 = &DAT_aaaaaaaaaaaaaaaa;
      local_40 = &DAT_aaaaaaaaaaaaaaaa;
      QVariant::toString();
      bVar1 = QString::isEmpty((QString *)0xa3327b);
      if (bVar1) {
        in_stack_ffffffffffffff7c = 2;
      }
      else {
        if (bVar2) {
          QChar::QChar<char16_t,_true>(&local_52,L' ');
          QString::operator+=((QString *)this,in_stack_ffffffffffffff7e);
        }
        QString::operator+=((QString *)this,
                            (QString *)CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68)
                           );
        bVar2 = true;
        in_stack_ffffffffffffff7c = 0;
      }
      in_stack_ffffffffffffff7e.ucs = L'\0';
      QString::~QString((QString *)0xa332d6);
      if (CONCAT22(in_stack_ffffffffffffff7e.ucs,in_stack_ffffffffffffff7c) != 0) break;
    }
    local_74 = local_74 + 1;
  }
  bVar2 = QString::isEmpty((QString *)0xa332fe);
  if (!bVar2) {
    QList<QString>::operator<<
              ((QList<QString> *)this,
               (parameter_type)CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68));
  }
  local_53 = QList<QString>::isEmpty((QList<QString> *)0xa3331b);
  if (!local_53) {
    QFont::setFamilies((QFont *)in_stack_ffffffffffffff80,
                       (QStringList *)
                       CONCAT26(in_stack_ffffffffffffff7e.ucs,
                                CONCAT24(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78)));
  }
  local_53 = !local_53;
  QList<QString>::~QList((QList<QString> *)0xa33356);
  QString::~QString((QString *)0xa33360);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_53;
}

Assistant:

static bool setFontFamilyFromValues(const QList<QCss::Value> &values, QFont *font, int start = 0)
{
    QString family;
    QStringList families;
    bool shouldAddSpace = false;
    for (int i = start; i < values.size(); ++i) {
        const QCss::Value &v = values.at(i);
        if (v.type == Value::TermOperatorComma) {
            families << family;
            family.clear();
            shouldAddSpace = false;
            continue;
        }
        const QString str = v.variant.toString();
        if (str.isEmpty())
            break;
        if (shouldAddSpace)
            family += u' ';
        family += str;
        shouldAddSpace = true;
    }
    if (!family.isEmpty())
        families << family;
    if (families.isEmpty())
        return false;
    font->setFamilies(families);
    return true;
}